

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void djb::brdf::io_to_hd(vec3 *wi,vec3 *wo,vec3 *wh,vec3 *wd)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec3 vVar5;
  float_t phi_h;
  float_t theta_h;
  float_t local_78;
  float_t local_74;
  vec3 local_70;
  vec3 local_60;
  vec3 local_50;
  vec3 local_40;
  
  local_60.x = 0.0;
  local_60.y = 1.0;
  local_60.z = 0.0;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_40.z = 1.0;
  uVar1 = wi->x;
  uVar3 = wi->y;
  uVar2 = wo->x;
  uVar4 = wo->y;
  local_70.y = (float)uVar4 + (float)uVar3;
  local_70.x = (float)uVar2 + (float)uVar1;
  local_70.z = wi->z + wo->z;
  vVar5 = normalize(&local_70);
  *wh = vVar5;
  xyz_to_theta_phi(wh,&local_74,&local_78);
  local_70 = rotate_vector(wi,&local_40,-local_78);
  local_50 = rotate_vector(&local_70,&local_60,-local_74);
  vVar5 = normalize(&local_50);
  *wd = vVar5;
  return;
}

Assistant:

void brdf::io_to_hd(const vec3 &wi, const vec3 &wo, vec3 *wh, vec3 *wd)
{
	const vec3 y = vec3(0, 1, 0);
	const vec3 z = vec3(0, 0, 1);
	float_t theta_h, phi_h;

	(*wh) = normalize(wi + wo);
	xyz_to_theta_phi(*wh, &theta_h, &phi_h);
	vec3 tmp = rotate_vector(wi, z, -phi_h);
	(*wd) = normalize(rotate_vector(tmp, y, -theta_h));
}